

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

void duckdb::ReservoirQuantileListOperation<short>::
     Finalize<duckdb::list_entry_t,duckdb::ReservoirQuantileState<short>>
               (ReservoirQuantileState<short> *state,list_entry_t *target,
               AggregateFinalizeData *finalize_data)

{
  AggregateInputData *this;
  FunctionData *pFVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint64_t uVar6;
  ulong uVar7;
  reference pvVar8;
  ulong uVar9;
  size_type __n;
  undefined1 auVar10 [16];
  double dVar11;
  
  if (state->pos != 0) {
    this = finalize_data->input;
    optional_ptr<duckdb::FunctionData,_true>::CheckValid(&this->bind_data);
    pFVar1 = (this->bind_data).ptr;
    lVar5 = duckdb::ListVector::GetEntry(finalize_data->result);
    uVar6 = duckdb::ListVector::GetListSize(finalize_data->result);
    duckdb::ListVector::Reserve
              (finalize_data->result,(*(long *)(pFVar1 + 0x10) - *(long *)(pFVar1 + 8) >> 3) + uVar6
              );
    lVar5 = *(long *)(lVar5 + 0x20);
    psVar2 = state->v;
    target->offset = uVar6;
    lVar3 = *(long *)(pFVar1 + 0x10);
    lVar4 = *(long *)(pFVar1 + 8);
    uVar7 = lVar3 - lVar4 >> 3;
    target->length = uVar7;
    if (lVar3 != lVar4) {
      __n = 0;
      do {
        pvVar8 = vector<double,_true>::operator[]((vector<double,_true> *)(pFVar1 + 8),__n);
        uVar7 = state->pos;
        lVar3 = uVar7 - 1;
        auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar10._0_8_ = lVar3;
        auVar10._12_4_ = 0x45300000;
        dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * *pvVar8;
        uVar9 = (ulong)dVar11;
        uVar9 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9;
        if ((uVar7 != 0) && (uVar7 != uVar9)) {
          lVar3 = 0x3f;
          if (uVar7 != 0) {
            for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
            }
          }
          std::__introselect<short*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (psVar2,psVar2 + uVar9,psVar2 + uVar7,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
        }
        *(short *)(lVar5 + uVar6 * 2 + __n * 2) = psVar2[uVar9];
        __n = __n + 1;
        uVar7 = target->length;
      } while (__n < uVar7);
      uVar6 = target->offset;
    }
    duckdb::ListVector::SetListSize(finalize_data->result,uVar6 + uVar7);
    return;
  }
  AggregateFinalizeData::ReturnNull(finalize_data);
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}

		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->template Cast<ReservoirQuantileBindData>();

		auto &result = ListVector::GetEntry(finalize_data.result);
		auto ridx = ListVector::GetListSize(finalize_data.result);
		ListVector::Reserve(finalize_data.result, ridx + bind_data.quantiles.size());
		auto rdata = FlatVector::GetData<CHILD_TYPE>(result);

		auto v_t = state.v;
		D_ASSERT(v_t);

		auto &entry = target;
		entry.offset = ridx;
		entry.length = bind_data.quantiles.size();
		for (size_t q = 0; q < entry.length; ++q) {
			const auto &quantile = bind_data.quantiles[q];
			auto offset = (idx_t)((double)(state.pos - 1) * quantile);
			std::nth_element(v_t, v_t + offset, v_t + state.pos);
			rdata[ridx + q] = v_t[offset];
		}

		ListVector::SetListSize(finalize_data.result, entry.offset + entry.length);
	}